

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j,short *data,stbi__huffman *hdc,int b)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int in_ECX;
  short *in_RSI;
  long in_RDI;
  int t;
  int dc;
  int diff;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  
  if (*(int *)(in_RDI + 0x4838) != 0) {
    iVar1 = stbi__err((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    return iVar1;
  }
  if (*(int *)(in_RDI + 0x4824) < 0x10) {
    stbi__grow_buffer_unsafe
              ((stbi__jpeg *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  if (*(int *)(in_RDI + 0x483c) == 0) {
    memset(in_RSI,0,0x80);
    iVar1 = stbi__jpeg_huff_decode
                      ((stbi__jpeg *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                       (stbi__huffman *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if ((iVar1 < 0) || (0xf < iVar1)) {
      iVar1 = stbi__err((char *)CONCAT44(in_stack_ffffffffffffffd4,iVar1));
      return iVar1;
    }
    if (iVar1 == 0) {
      iVar2 = 0;
    }
    else {
      iVar2 = stbi__extend_receive
                        ((stbi__jpeg *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                         in_stack_ffffffffffffffd4);
    }
    iVar3 = stbi__addints_valid(*(int *)(in_RDI + (long)in_ECX * 0x60 + 0x46b8),iVar2);
    if (iVar3 == 0) {
      iVar1 = stbi__err((char *)CONCAT44(in_stack_ffffffffffffffd4,iVar1));
      return iVar1;
    }
    iVar2 = *(int *)(in_RDI + (long)in_ECX * 0x60 + 0x46b8) + iVar2;
    *(int *)(in_RDI + (long)in_ECX * 0x60 + 0x46b8) = iVar2;
    iVar3 = stbi__mul2shorts_valid(iVar2,1 << ((byte)*(undefined4 *)(in_RDI + 0x4840) & 0x1f));
    if (iVar3 == 0) {
      iVar1 = stbi__err((char *)CONCAT44(iVar2,iVar1));
      return iVar1;
    }
    *in_RSI = (short)iVar2 * (short)(1 << ((byte)*(undefined4 *)(in_RDI + 0x4840) & 0x1f));
  }
  else {
    iVar1 = stbi__jpeg_get_bit((stbi__jpeg *)
                               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (iVar1 != 0) {
      *in_RSI = *in_RSI + (short)(1 << ((byte)*(undefined4 *)(in_RDI + 0x4840) & 0x1f));
    }
  }
  return 1;
}

Assistant:

static int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j, short data[64], stbi__huffman *hdc, int b)
{
   int diff,dc;
   int t;
   if (j->spec_end != 0) return stbi__err("can't merge dc and ac", "Corrupt JPEG");

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);

   if (j->succ_high == 0) {
      // first scan for DC coefficient, must be first
      memset(data,0,64*sizeof(data[0])); // 0 all the ac values now
      t = stbi__jpeg_huff_decode(j, hdc);
      if (t < 0 || t > 15) return stbi__err("can't merge dc and ac", "Corrupt JPEG");
      diff = t ? stbi__extend_receive(j, t) : 0;

      if (!stbi__addints_valid(j->img_comp[b].dc_pred, diff)) return stbi__err("bad delta", "Corrupt JPEG");
      dc = j->img_comp[b].dc_pred + diff;
      j->img_comp[b].dc_pred = dc;
      if (!stbi__mul2shorts_valid(dc, 1 << j->succ_low)) return stbi__err("can't merge dc and ac", "Corrupt JPEG");
      data[0] = (short) (dc * (1 << j->succ_low));
   } else {
      // refinement scan for DC coefficient
      if (stbi__jpeg_get_bit(j))
         data[0] += (short) (1 << j->succ_low);
   }
   return 1;
}